

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::FieldDescriptorProto::FieldDescriptorProto(FieldDescriptorProto *this)

{
  FieldDescriptorProto *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__FieldDescriptorProto_009c0b60;
  ::std::__cxx11::string::string((string *)&this->name_);
  this->number_ = 0;
  this->label_ = 0;
  this->type_ = 0;
  ::std::__cxx11::string::string((string *)&this->type_name_);
  ::std::__cxx11::string::string((string *)&this->extendee_);
  ::std::__cxx11::string::string((string *)&this->default_value_);
  this->oneof_index_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<10UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto() = default;